

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_failure_fail_tests.cpp
# Opt level: O2

void __thiscall
iu_NoFailureTest_x_iutest_x_Assert_Test::Body(iu_NoFailureTest_x_iutest_x_Assert_Test *this)

{
  iuCodeMessage local_1c0;
  Counter<iutest::detail::NewTestPartResultCheckHelper::CondGt<(iutest::TestPartResult::Type)0>,_iutest::detail::DefaultGlobalTestPartResultReporter>
  iutest_failure_checker;
  
  iutest::detail::NewTestPartResultCheckHelper::
  Counter<iutest::detail::NewTestPartResultCheckHelper::CondGt<(iutest::TestPartResult::Type)0>,_iutest::detail::DefaultGlobalTestPartResultReporter>
  ::Counter(&iutest_failure_checker);
  OccurFatalFailure();
  iutest::detail::NewTestPartResultCheckHelper::ReporterHolder::~ReporterHolder
            (&iutest_failure_checker.m_holder);
  if (iutest_failure_checker.m_count < 1) {
    nCount = nCount + 1;
  }
  else {
    memset(&iutest_failure_checker,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_failure_fail_tests.cpp"
               ,0x26,
               "\nExpected: OccurFatalFailure() doesn\'t generate new failure.\n  Actual: it does.")
    ;
    local_1c0._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_1c0,(Fixed *)&iutest_failure_checker);
    std::__cxx11::string::~string((string *)&local_1c0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
  }
  return;
}

Assistant:

IUTEST(NoFailureTest, Assert)
{
    IUTEST_ASSERT_NO_FAILURE(OccurFatalFailure());
    ++nCount;
}